

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

_Bool mpack_expect_bool(mpack_reader_t *reader)

{
  byte bVar1;
  
  bVar1 = mpack_expect_native_u8(reader);
  if ((bVar1 & 0xfe) != 0xc2) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool mpack_expect_bool(mpack_reader_t* reader) {
    uint8_t type = mpack_expect_type_byte(reader);
    if ((type & ~1) != 0xc2)
        mpack_reader_flag_error(reader, mpack_error_type);
    return (bool)(type & 1);
}